

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O2

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat_conflict *st)

{
  size_t __len;
  long offset;
  bool bVar1;
  int iVar2;
  uint uVar3;
  mode_t mVar4;
  wchar_t wVar5;
  char *pcVar6;
  la_int64_t lVar7;
  char *pcVar8;
  __off_t _Var10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  long lVar14;
  uint *puVar15;
  __off_t _Var16;
  int iVar17;
  int local_10e4;
  __off_t local_10e0;
  ulong local_10d8;
  ulong local_10d0;
  stat_conflict s;
  int stflags;
  undefined8 local_1030;
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar9;
  
  local_10e4 = fd;
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_entry_from_file");
  if (iVar2 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat_conflict *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &s;
          iVar2 = lstat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar12 = __errno_location();
            iVar2 = *piVar12;
            pcVar8 = "Can\'t lstat %s";
            goto LAB_0013157c;
          }
        }
        else {
          st = &s;
          iVar2 = stat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar12 = __errno_location();
            iVar2 = *piVar12;
            pcVar8 = "Can\'t stat %s";
LAB_0013157c:
            archive_set_error(_a,iVar2,pcVar8,pcVar6);
            return -0x19;
          }
        }
      }
      else {
        st = &s;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar12 = __errno_location();
          iVar2 = *piVar12;
          pcVar6 = "Can\'t fstat";
          goto LAB_001313a3;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar7 = archive_entry_uid(entry);
  pcVar8 = archive_read_disk_uname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar8);
  }
  lVar7 = archive_entry_gid(entry);
  pcVar8 = archive_read_disk_gname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar8);
  }
  if ((((ulong)_a[1].error_string.s & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10e4 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar6,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar6,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10e4);
      if (local_10e4 < 0) goto LAB_0013134b;
    }
    iVar2 = ioctl(local_10e4,0x80086601,&stflags);
    if (stflags != 0 && iVar2 == 0) {
      archive_entry_set_fflags(entry,(long)stflags,0);
    }
  }
LAB_0013134b:
  if ((st->st_mode & 0xf000) == 0xa000) {
    __len = st->st_size;
    pcVar8 = (char *)malloc(__len + 1);
    if (pcVar8 == (char *)0x0) {
      pcVar6 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_001313a3:
      archive_set_error(_a,iVar2,pcVar6);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar9 = readlink(pcVar6,pcVar8,__len);
      uVar3 = (uint)sVar9;
    }
    else {
      iVar2 = (**(code **)&_a[1].file_count)();
      sVar9 = readlinkat(iVar2,pcVar6,pcVar8,__len);
      uVar3 = (uint)sVar9;
    }
    if ((int)uVar3 < 0) {
      piVar12 = __errno_location();
      archive_set_error(_a,*piVar12,"Couldn\'t read link data");
      free(pcVar8);
      return -0x19;
    }
    pcVar8[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar8);
    free(pcVar8);
  }
  iVar2 = 0;
  if ((((((ulong)_a[1].error_string.s & 0x80) != 0) ||
       (mVar4 = archive_entry_filetype(entry), mVar4 != 0x8000)) ||
      (lVar7 = archive_entry_size(entry), lVar7 < 1)) ||
     (pcVar6 = archive_entry_hardlink(entry), iVar2 = 0, pcVar6 != (char *)0x0)) goto LAB_0013180f;
  if ((local_10e4 < 0) &&
     (pcVar6 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e4),
     local_10e4 < 0)) {
    iVar2 = -0x19;
    if (pcVar6 == (char *)0x0) goto LAB_0013180f;
    local_10e4 = open(pcVar6,0x80800);
    if (-1 < local_10e4) {
      __archive_ensure_cloexec_flag(local_10e4);
      _Var16 = 0;
      goto LAB_00131478;
    }
LAB_00131883:
    iVar2 = -0x19;
    piVar12 = __errno_location();
    archive_set_error(_a,*piVar12,"Can\'t open `%s\'",pcVar6);
  }
  else {
    _Var10 = lseek(local_10e4,0,1);
    _Var16 = 0;
    if (_Var10 != 0) {
      lseek(local_10e4,0,0);
      _Var16 = _Var10;
    }
LAB_00131478:
    iVar2 = 0;
    _Var10 = lseek(local_10e4,0,4);
    if (-1 < _Var10) {
      local_10e0 = _Var16;
      if (_Var10 != 0) {
        lseek(local_10e4,0,0);
      }
      local_10d8 = archive_entry_size(entry);
      iVar2 = 0;
      uVar11 = 0;
      while (_Var16 = local_10e0, (long)uVar11 < (long)local_10d8) {
        _Var10 = lseek(local_10e4,uVar11,3);
        if (_Var10 == -1) {
          piVar12 = __errno_location();
          _Var16 = local_10e0;
          iVar2 = *piVar12;
          if (iVar2 == 6) {
            wVar5 = archive_entry_sparse_count(entry);
            iVar2 = 0;
            if (wVar5 == L'\0') {
              iVar2 = 0;
              _Var10 = lseek(local_10e4,0,4);
              if (_Var10 == 0) {
                iVar2 = 0;
                uVar11 = lseek(local_10e4,0,2);
                if (uVar11 == local_10d8) {
                  iVar2 = 0;
                  archive_entry_sparse_add_entry(entry,0,0);
                }
              }
            }
          }
          else {
            pcVar6 = "lseek(SEEK_HOLE) failed";
LAB_001317f1:
            archive_set_error(_a,iVar2,pcVar6);
            iVar2 = -0x19;
          }
          break;
        }
        uVar11 = lseek(local_10e4,_Var10,4);
        if (uVar11 == 0xffffffffffffffff) {
          piVar12 = __errno_location();
          _Var16 = local_10e0;
          iVar2 = *piVar12;
          if (iVar2 == 6) {
            _Var10 = lseek(local_10e4,0,2);
            iVar2 = 0;
            if (_Var10 != -1) break;
            iVar2 = *piVar12;
          }
          pcVar6 = "lseek(SEEK_DATA) failed";
          goto LAB_001317f1;
        }
        _Var16 = local_10e0;
        if (uVar11 == local_10d8 && _Var10 == 0) break;
        archive_entry_sparse_add_entry(entry,_Var10,uVar11 - _Var10);
      }
      lseek(local_10e4,_Var16,0);
      goto LAB_0013180f;
    }
    mVar4 = archive_entry_filetype(entry);
    if (((mVar4 != 0x8000) || (lVar7 = archive_entry_size(entry), lVar7 < 1)) ||
       (pcVar6 = archive_entry_hardlink(entry), pcVar6 != (char *)0x0)) goto LAB_0013180f;
    if (local_10e4 < 0) {
      pcVar6 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
      iVar2 = -0x19;
      if (pcVar6 == (char *)0x0) goto LAB_0013180f;
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar6,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar6,0x80800);
      }
      if (local_10e4 < 0) goto LAB_00131883;
      __archive_ensure_cloexec_flag(local_10e4);
    }
    memset(&stflags,0,0x1000);
    local_1030 = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    local_10d8 = archive_entry_size(entry);
    iVar17 = 0;
    local_10d0 = 0xc020660b;
    while (iVar2 = ioctl(local_10e4,local_10d0,&stflags), -1 < iVar2) {
      local_10e0 = CONCAT44(local_10e0._4_4_,iVar17);
      if (local_1024 == 0) {
        iVar2 = 0;
        if (iVar17 == 0) {
          iVar2 = 0;
          archive_entry_sparse_add_entry(entry,0,0);
        }
        goto LAB_0013180f;
      }
      puVar15 = local_ff0;
      bVar1 = true;
      uVar3 = local_1024;
      for (iVar17 = 0; iVar17 < (int)uVar3; iVar17 = iVar17 + 1) {
        uVar13 = *puVar15;
        if ((uVar13 >> 0xb & 1) == 0) {
          offset = *(long *)(puVar15 + -10);
          uVar11 = offset + *(long *)(puVar15 + -6);
          iVar2 = 0;
          lVar14 = 0;
          if (local_10d8 <= uVar11) {
            lVar14 = uVar11 - local_10d8;
          }
          uVar11 = *(long *)(puVar15 + -6) - lVar14;
          if (uVar11 == local_10d8 && offset == 0) goto LAB_0013180f;
          if (0 < (long)uVar11) {
            archive_entry_sparse_add_entry(entry,offset,uVar11);
            uVar13 = *puVar15;
            uVar3 = local_1024;
          }
        }
        if ((uVar13 & 1) != 0) {
          bVar1 = false;
        }
        puVar15 = puVar15 + 0xe;
      }
      if (!bVar1) break;
      _stflags = s.__glibc_reserved[(ulong)uVar3 * 7 + 2] + s.__glibc_reserved[(ulong)uVar3 * 7];
      iVar17 = (int)local_10e0 + 1;
    }
    iVar2 = 0;
  }
LAB_0013180f:
  if (local_10e4 != fd) {
    close(local_10e4);
  }
  return iVar2;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
		"archive_read_disk_entry_from_file");

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (la_stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len + 1);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = '\0';
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if ((a->flags & ARCHIVE_READDISK_NO_SPARSE) == 0) {
		r1 = setup_sparse(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}